

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

char * apx_file_type_to_extension(apx_fileType_t file_type)

{
  char *pcStack_10;
  apx_fileType_t file_type_local;
  
  switch(file_type) {
  case '\x01':
    pcStack_10 = ".apx";
    break;
  case '\x02':
    pcStack_10 = ".out";
    break;
  case '\x03':
    pcStack_10 = ".in";
    break;
  case '\x04':
    pcStack_10 = ".cout";
    break;
  case '\x05':
    pcStack_10 = ".cin";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

char const* apx_file_type_to_extension(apx_fileType_t file_type)
{
   switch (file_type)
   {
   case APX_DEFINITION_FILE_TYPE:
      return APX_DEFINITION_FILE_EXT;
   case APX_PROVIDE_PORT_DATA_FILE_TYPE:
      return APX_PROVIDE_PORT_DATA_EXT;
   case APX_REQUIRE_PORT_DATA_FILE_TYPE:
      return APX_REQUIRE_PORT_DATA_EXT;
   case APX_PROVIDE_PORT_COUNT_FILE_TYPE:
      return APX_PROVIDE_PORT_COUNT_EXT;
   case APX_REQUIRE_PORT_COUNT_FILE_TYPE:
      return APX_REQUIRE_PORT_COUNT_EXT;
   }
   return "";
}